

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O0

void __thiscall Assimp::DeboneProcess::UpdateNode(DeboneProcess *this,aiNode *pNode)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  void *pvVar6;
  iterator __first;
  iterator __last;
  uint local_84;
  uint a_2;
  uint local_70;
  uint b_1;
  uint nSubmeshes_1;
  vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
  *subMeshes_1;
  uint a_1;
  uint local_50;
  uint b;
  uint nSubmeshes;
  vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
  *subMeshes;
  uint srcIndex;
  uint a;
  uint n;
  uint m;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newMeshList;
  aiNode *pNode_local;
  DeboneProcess *this_local;
  
  newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pNode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
  uVar1 = newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[0x118];
  sVar2 = std::
          vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
          ::size(&this->mSubMeshIndices);
  for (subMeshes._4_4_ = 0; subMeshes._4_4_ < uVar1; subMeshes._4_4_ = subMeshes._4_4_ + 1) {
    pvVar3 = std::
             vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
             ::operator[](&this->mSubMeshIndices,
                          (ulong)*(uint *)(*(long *)(newMeshList.
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 0x11a) + (ulong)subMeshes._4_4_ * 4));
    sVar4 = std::
            vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
            ::size(pvVar3);
    for (local_50 = 0; local_50 < (uint)sVar4; local_50 = local_50 + 1) {
      pvVar5 = std::
               vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
               ::operator[](pvVar3,(ulong)local_50);
      if (pvVar5->second == (aiNode *)0x0) {
        pvVar5 = std::
                 vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                 ::operator[](pvVar3,(ulong)local_50);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n,&pvVar5->first);
      }
    }
  }
  for (subMeshes_1._0_4_ = 0; (uint)subMeshes_1 < (uint)sVar2;
      subMeshes_1._0_4_ = (uint)subMeshes_1 + 1) {
    pvVar3 = std::
             vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
             ::operator[](&this->mSubMeshIndices,(ulong)(uint)subMeshes_1);
    sVar4 = std::
            vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
            ::size(pvVar3);
    for (local_70 = 0; local_70 < (uint)sVar4; local_70 = local_70 + 1) {
      pvVar5 = std::
               vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
               ::operator[](pvVar3,(ulong)local_70);
      if (pvVar5->second ==
          (aiNode *)
          newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pvVar5 = std::
                 vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
                 ::operator[](pvVar3,(ulong)local_70);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n,&pvVar5->first);
      }
    }
  }
  if (newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x118] != 0) {
    if (*(void **)(newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x11a) != (void *)0x0) {
      operator_delete__(*(void **)(newMeshList.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x11a));
    }
    newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[0x11a] = 0;
    newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[0x11b] = 0;
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
  newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[0x118] = (uint)sVar2;
  if (newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x118] != 0) {
    pvVar6 = operator_new__((ulong)newMeshList.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage[0x118] << 2);
    *(void **)(newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x11a) = pvVar6;
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current,
               *(uint **)(newMeshList.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 0x11a));
  }
  for (local_84 = 0;
      local_84 <
      newMeshList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0x114]; local_84 = local_84 + 1) {
    UpdateNode(this,*(aiNode **)
                     (*(long *)(newMeshList.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 0x116) +
                     (ulong)local_84 * 8));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
  return;
}

Assistant:

void DeboneProcess::UpdateNode(aiNode* pNode) const
{
    // rebuild the node's mesh index list

    std::vector<unsigned int> newMeshList;

    // this will require two passes

    unsigned int m = static_cast<unsigned int>(pNode->mNumMeshes), n = static_cast<unsigned int>(mSubMeshIndices.size());

    // first pass, look for meshes which have not moved

    for(unsigned int a=0;a<m;a++)   {

        unsigned int srcIndex = pNode->mMeshes[a];
        const std::vector< std::pair< unsigned int,aiNode* > > &subMeshes = mSubMeshIndices[srcIndex];
        unsigned int nSubmeshes = static_cast<unsigned int>(subMeshes.size());

        for(unsigned int b=0;b<nSubmeshes;b++) {
            if(!subMeshes[b].second) {
                newMeshList.push_back(subMeshes[b].first);
            }
        }
    }

    // second pass, collect deboned meshes

    for(unsigned int a=0;a<n;a++)
    {
        const std::vector< std::pair< unsigned int,aiNode* > > &subMeshes = mSubMeshIndices[a];
        unsigned int nSubmeshes = static_cast<unsigned int>(subMeshes.size());

        for(unsigned int b=0;b<nSubmeshes;b++) {
            if(subMeshes[b].second == pNode)    {
                newMeshList.push_back(subMeshes[b].first);
            }
        }
    }

    if( pNode->mNumMeshes > 0 ) {
        delete [] pNode->mMeshes; pNode->mMeshes = NULL;
    }

    pNode->mNumMeshes = static_cast<unsigned int>(newMeshList.size());

    if(pNode->mNumMeshes)   {
        pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
        std::copy( newMeshList.begin(), newMeshList.end(), pNode->mMeshes);
    }

    // do that also recursively for all children
    for( unsigned int a = 0; a < pNode->mNumChildren; ++a ) {
        UpdateNode( pNode->mChildren[a]);
    }
}